

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.h
# Opt level: O0

void complex_sen(treeNode *tn)

{
  bool bVar1;
  vector<treeNode_*,_std::allocator<treeNode_*>_> *pvVar2;
  treeNode *ptVar3;
  string local_170 [38];
  undefined1 local_14a;
  allocator local_149;
  string local_148 [32];
  treeNode *local_128;
  undefined1 local_11a;
  allocator local_119;
  string local_118 [32];
  treeNode *local_f8;
  treeNode *sen_BLOCKts;
  undefined1 local_ca;
  allocator local_c9;
  string local_c8 [32];
  treeNode *local_a8;
  undefined1 local_9a;
  allocator local_99;
  string local_98 [32];
  treeNode *local_78;
  treeNode *sen_BLOCKt;
  undefined1 local_4d;
  allocator local_39;
  string local_38 [32];
  treeNode *local_18;
  treeNode *local_10;
  treeNode *tn_local;
  
  local_10 = tn;
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          sym_abi_cxx11_,"begin");
  if (bVar1) {
    pvVar2 = &local_10->child;
    ptVar3 = (treeNode *)operator_new(0x38);
    local_4d = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"begin",&local_39);
    treeNode::treeNode(ptVar3,(string *)local_38);
    local_4d = 0;
    local_18 = ptVar3;
    std::vector<treeNode_*,_std::allocator<treeNode_*>_>::push_back(pvVar2,&local_18);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    GETSYM_abi_cxx11_();
    std::__cxx11::string::operator=((string *)sym_abi_cxx11_,(string *)&sen_BLOCKt);
    std::__cxx11::string::~string((string *)&sen_BLOCKt);
    ptVar3 = (treeNode *)operator_new(0x38);
    local_9a = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,anon_var_dwarf_6b66 + 6,&local_99);
    treeNode::treeNode(ptVar3,(string *)local_98);
    local_9a = 0;
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    local_78 = ptVar3;
    std::vector<treeNode_*,_std::allocator<treeNode_*>_>::push_back(&local_10->child,&local_78);
    sen_BLOCK(local_78);
    while (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)sym_abi_cxx11_,";"), bVar1) {
      pvVar2 = &local_10->child;
      ptVar3 = (treeNode *)operator_new(0x38);
      local_ca = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c8,";",&local_c9);
      treeNode::treeNode(ptVar3,(string *)local_c8);
      local_ca = 0;
      local_a8 = ptVar3;
      std::vector<treeNode_*,_std::allocator<treeNode_*>_>::push_back(pvVar2,&local_a8);
      std::__cxx11::string::~string(local_c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_c9);
      GETSYM_abi_cxx11_();
      std::__cxx11::string::operator=((string *)sym_abi_cxx11_,(string *)&sen_BLOCKts);
      std::__cxx11::string::~string((string *)&sen_BLOCKts);
      ptVar3 = (treeNode *)operator_new(0x38);
      local_11a = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_118,anon_var_dwarf_6b66 + 6,&local_119);
      treeNode::treeNode(ptVar3,(string *)local_118);
      local_11a = 0;
      std::__cxx11::string::~string(local_118);
      std::allocator<char>::~allocator((allocator<char> *)&local_119);
      local_f8 = ptVar3;
      std::vector<treeNode_*,_std::allocator<treeNode_*>_>::push_back(&local_10->child,&local_f8);
      sen_BLOCK(local_f8);
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            sym_abi_cxx11_,"end");
    if (bVar1) {
      pvVar2 = &local_10->child;
      ptVar3 = (treeNode *)operator_new(0x38);
      local_14a = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_148,"end",&local_149);
      treeNode::treeNode(ptVar3,(string *)local_148);
      local_14a = 0;
      local_128 = ptVar3;
      std::vector<treeNode_*,_std::allocator<treeNode_*>_>::push_back(pvVar2,&local_128);
      std::__cxx11::string::~string(local_148);
      std::allocator<char>::~allocator((allocator<char> *)&local_149);
      GETSYM_abi_cxx11_();
      std::__cxx11::string::operator=((string *)sym_abi_cxx11_,local_170);
      std::__cxx11::string::~string(local_170);
    }
    else {
      error_exc(0x10);
    }
  }
  return;
}

Assistant:

void complex_sen(treeNode* tn)
{
    if (sym == "begin") {
        tn->child.push_back(new treeNode("begin"));
        sym = GETSYM();
        auto *sen_BLOCKt = new treeNode("语句");
        tn->child.push_back(sen_BLOCKt);
        sen_BLOCK(sen_BLOCKt);
        while (sym == ";") {
            tn->child.push_back(new treeNode(";"));
            sym = GETSYM();
            auto *sen_BLOCKts = new treeNode("语句");
            tn->child.push_back(sen_BLOCKts);
            sen_BLOCK(sen_BLOCKts);
        }
        if (sym == "end") {
            tn->child.push_back(new treeNode("end"));
            sym = GETSYM();
        }
        else error_exc(complex_end_wrong);           //不是正确的复合语句结束
    } else return;
}